

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units_decl.hpp
# Opt level: O0

bool units::detail::compare_round_equals(float val1,float val2)

{
  int iVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  bool local_21;
  float c2;
  float c1;
  float v1;
  float val2_local;
  float val1_local;
  
  fVar2 = val1 - val2;
  if (((fVar2 == 0.0) && (!NAN(fVar2))) || (iVar1 = std::fpclassify(fVar2), iVar1 == 3)) {
    val2_local._3_1_ = true;
  }
  else {
    fVar2 = cround(val1);
    fVar3 = cround(val2);
    local_21 = true;
    if ((fVar2 != fVar3) || (NAN(fVar2) || NAN(fVar3))) {
      fVar4 = cround(val2 * 1.0000005);
      local_21 = true;
      if ((fVar4 != fVar2) || (NAN(fVar4) || NAN(fVar2))) {
        fVar4 = cround(val2 * 0.9999995);
        local_21 = true;
        if ((fVar4 != fVar2) || (NAN(fVar4) || NAN(fVar2))) {
          fVar2 = cround(val1 * 1.0000005);
          local_21 = true;
          if ((fVar2 != fVar3) || (NAN(fVar2) || NAN(fVar3))) {
            fVar2 = cround(val1 * 0.9999995);
            local_21 = fVar2 == fVar3;
          }
        }
      }
    }
    val2_local._3_1_ = local_21;
  }
  return val2_local._3_1_;
}

Assistant:

inline bool compare_round_equals(float val1, float val2)
    {
        static constexpr float half_precision{5e-7F};
        auto v1 = val1 - val2;
        if (v1 == 0.0F || std::fpclassify(v1) == FP_SUBNORMAL) {
            return true;
        }
        auto c1 = cround(val1);
        auto c2 = cround(val2);
        // yes these are magic numbers half the value of specified precision of
        // 1e-6 for units
        return (c1 == c2) || (cround(val2 * (1.0F + half_precision)) == c1) ||
            (cround(val2 * (1.0F - half_precision)) == c1) ||
            (cround(val1 * (1.0F + half_precision)) == c2) ||
            (cround(val1 * (1.0F - half_precision)) == c2);
    }